

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
DebugDrawcallback::processTriangle
          (DebugDrawcallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtTransform *this_00;
  cbtVector3 *pcVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar7 [64];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [56];
  undefined1 auVar16 [64];
  undefined1 auVar14 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  cbtVector3 cVar21;
  cbtVector3 cVar22;
  cbtVector3 cVar23;
  cbtVector3 center;
  cbtVector3 normal;
  float local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  cbtVector3 local_98;
  cbtVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  cbtVector3 local_38;
  
  auVar20 = in_ZMM1._8_56_;
  auVar11 = in_ZMM0._8_56_;
  this_00 = &this->m_worldTrans;
  cVar21 = cbtTransform::operator()(this_00,triangle);
  auVar16._0_8_ = cVar21.m_floats._8_8_;
  auVar16._8_56_ = auVar20;
  auVar7._0_8_ = cVar21.m_floats._0_8_;
  auVar7._8_56_ = auVar11;
  auVar6 = auVar7._0_16_;
  auVar14 = auVar16._0_16_;
  local_48 = vmovlhps_avx(auVar6,auVar14);
  auVar12 = ZEXT856(local_48._8_8_);
  cVar22 = cbtTransform::operator()(this_00,triangle + 1);
  auVar17._0_8_ = cVar22.m_floats._8_8_;
  auVar17._8_56_ = auVar20;
  auVar8._0_8_ = cVar22.m_floats._0_8_;
  auVar8._8_56_ = auVar12;
  local_58 = vmovlhps_avx(auVar8._0_16_,auVar17._0_16_);
  auVar13 = ZEXT856(local_58._8_8_);
  cVar23 = cbtTransform::operator()(this_00,triangle + 2);
  auVar18._0_8_ = cVar23.m_floats._8_8_;
  auVar18._8_56_ = auVar20;
  auVar9._0_8_ = cVar23.m_floats._0_8_;
  auVar9._8_56_ = auVar13;
  local_68 = vmovlhps_avx(auVar9._0_16_,auVar18._0_16_);
  local_118 = cVar22.m_floats[2];
  local_f8 = cVar21.m_floats[2];
  local_108 = cVar22.m_floats[0];
  fStack_104 = cVar22.m_floats[1];
  fStack_100 = auVar12._0_4_;
  fStack_fc = auVar12._4_4_;
  local_e8 = cVar21.m_floats[0];
  fStack_e4 = cVar21.m_floats[1];
  fStack_e0 = auVar11._0_4_;
  fStack_dc = auVar11._4_4_;
  auVar15._0_4_ = local_108 + local_e8 + cVar23.m_floats[0];
  auVar15._4_4_ = fStack_104 + fStack_e4 + cVar23.m_floats[1];
  auVar15._8_4_ = fStack_100 + fStack_e0 + auVar13._0_4_;
  auVar15._12_4_ = fStack_fc + fStack_dc + auVar13._4_4_;
  auVar5._8_4_ = 0x3eaaaaab;
  auVar5._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar5._12_4_ = 0x3eaaaaab;
  auVar5 = vmulps_avx512vl(auVar15,auVar5);
  fVar2 = (local_118 + local_f8 + cVar23.m_floats[2]) * 0.33333334;
  local_78 = vinsertps_avx(auVar5,ZEXT416((uint)fVar2),0x28);
  uVar4 = (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xe])();
  if ((uVar4 >> 0xe & 1) != 0) {
    auVar15 = vsubps_avx(auVar8._0_16_,auVar6);
    auVar3 = vsubps_avx(auVar17._0_16_,auVar14);
    local_98.m_floats = (cbtScalar  [4])vinsertps_avx(auVar15,auVar3,0x28);
    auVar14 = vsubps_avx(auVar18._0_16_,auVar14);
    auVar12 = ZEXT856(auVar14._8_8_);
    auVar6 = vsubps_avx(auVar9._0_16_,auVar6);
    local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,auVar14,0x28);
    auVar11 = ZEXT856(local_88.m_floats._8_8_);
    cVar21 = cbtVector3::cross(&local_98,&local_88);
    auVar19._0_8_ = cVar21.m_floats._8_8_;
    auVar19._8_56_ = auVar12;
    auVar10._0_8_ = cVar21.m_floats._0_8_;
    auVar10._8_56_ = auVar11;
    local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar19._0_16_);
    cbtVector3::normalize(&local_38);
    local_98.m_floats = (cbtScalar  [4])ZEXT816(0x3f8000003f800000);
    local_a8 = auVar5._0_4_;
    fStack_a4 = auVar5._4_4_;
    fStack_a0 = auVar5._8_4_;
    fStack_9c = auVar5._12_4_;
    auVar6._0_4_ = local_38.m_floats[0] + local_a8;
    auVar6._4_4_ = local_38.m_floats[1] + fStack_a4;
    auVar6._8_4_ = fStack_a0 + 0.0;
    auVar6._12_4_ = fStack_9c + 0.0;
    local_88.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar6,ZEXT416((uint)(fVar2 + local_38.m_floats[2])),0x28);
    (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_78,&local_88,&local_98)
    ;
  }
  pcVar1 = &this->m_color;
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_48,local_58,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_58,local_68,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_68,local_48,pcVar1);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		(void)partId;
		(void)triangleIndex;

		cbtVector3 wv0, wv1, wv2;
		wv0 = m_worldTrans * triangle[0];
		wv1 = m_worldTrans * triangle[1];
		wv2 = m_worldTrans * triangle[2];
		cbtVector3 center = (wv0 + wv1 + wv2) * cbtScalar(1. / 3.);

		if (m_debugDrawer->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
		{
			cbtVector3 normal = (wv1 - wv0).cross(wv2 - wv0);
			normal.normalize();
			cbtVector3 normalColor(1, 1, 0);
			m_debugDrawer->drawLine(center, center + normal, normalColor);
		}
		m_debugDrawer->drawLine(wv0, wv1, m_color);
		m_debugDrawer->drawLine(wv1, wv2, m_color);
		m_debugDrawer->drawLine(wv2, wv0, m_color);
	}